

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer.cpp
# Opt level: O3

MPP_RET mpp_buffer_import_with_tag
                  (MppBufferGroup group,MppBufferInfo *info,MppBuffer *buffer,char *tag,char *caller
                  )

{
  MppBufferType MVar1;
  MPP_RET MVar2;
  MppBufferImpl *buf;
  
  if (info == (MppBufferInfo *)0x0) {
    _mpp_log_l(2,"mpp_buffer","mpp_buffer_commit invalid input: info NULL from %s\n",(char *)0x0,
               caller);
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    if (group == (MppBufferGroup)0x0) {
      group = mpp_buffer_get_misc_group(MPP_BUFFER_EXTERNAL,info->type);
      if ((MppBufferGroupImpl *)group == (MppBufferGroupImpl *)0x0) {
        group = (MppBufferGroupImpl *)0x0;
        _mpp_log_l(2,"mpp_buffer","Assertion %s failed at %s:%d\n",(char *)0x0,"p",
                   "mpp_buffer_import_with_tag",0x32);
        if ((mpp_debug._3_1_ & 0x10) != 0) {
          abort();
        }
      }
    }
    else {
      MVar1 = *(MppBufferType *)((long)group + 0x4c) & 0xffff;
      if ((*(uint *)((long)group + 0x48) != 1 || MVar1 != info->type) ||
          MPP_BUFFER_TYPE_DMA_HEAP < MVar1) {
        _mpp_log_l(2,"mpp_buffer",
                   "mpp_buffer_commit invalid type found group %d info %d group mode %d from %s\n",
                   (char *)0x0,(ulong)*(MppBufferType *)((long)group + 0x4c),(ulong)info->type,
                   (ulong)*(uint *)((long)group + 0x48),caller);
        return MPP_ERR_UNKNOW;
      }
    }
    if (buffer == (MppBuffer *)0x0) {
      MVar2 = mpp_buffer_create(tag,caller,(MppBufferGroupImpl *)group,info,(MppBufferImpl **)0x0);
      return MVar2;
    }
    buf = (MppBufferImpl *)0x0;
    MVar2 = mpp_buffer_create(tag,caller,(MppBufferGroupImpl *)group,info,&buf);
    *buffer = buf;
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_buffer_import_with_tag(MppBufferGroup group, MppBufferInfo *info, MppBuffer *buffer,
                                   const char *tag, const char *caller)
{
    if (NULL == info) {
        mpp_err("mpp_buffer_commit invalid input: info NULL from %s\n", caller);
        return MPP_ERR_NULL_PTR;
    }

    MppBufferGroupImpl *p = (MppBufferGroupImpl *)group;

    if (p) {
        // if group is specified we need to check the parameter
        if ((p->type & MPP_BUFFER_TYPE_MASK) != info->type ||
            (p->type & MPP_BUFFER_TYPE_MASK) >= MPP_BUFFER_TYPE_BUTT ||
            p->mode != MPP_BUFFER_EXTERNAL) {
            mpp_err("mpp_buffer_commit invalid type found group %d info %d group mode %d from %s\n",
                    p->type, info->type, p->mode, caller);
            return MPP_ERR_UNKNOW;
        }
    } else {
        // otherwise use default external group to manage them
        p = mpp_buffer_get_misc_group(MPP_BUFFER_EXTERNAL, info->type);
    }

    mpp_assert(p);

    MPP_RET ret = MPP_OK;
    if (buffer) {
        MppBufferImpl *buf = NULL;
        ret = mpp_buffer_create(tag, caller, p, info, &buf);
        *buffer = buf;
    } else {
        ret = mpp_buffer_create(tag, caller, p, info, NULL);
    }
    return ret;
}